

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  uchar uVar1;
  byte bVar2;
  Mem *pVal;
  double dVar3;
  DateTime *p_00;
  byte bVar4;
  int iVar5;
  uint N;
  uint uVar6;
  uchar *zDate;
  byte *pbVar7;
  int iVar8;
  long lVar9;
  float *pfVar10;
  double dVar11;
  int iVar12;
  uchar *zDate_00;
  byte *pbVar13;
  byte *pbVar14;
  DateTime *pDVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  ulong uStack_e0;
  int M;
  DateTime *local_c8;
  int local_c0;
  int M_1;
  sqlite3_context *local_b8;
  int D;
  double local_a8;
  int Y;
  undefined4 uStack_9c;
  sqlite3_value **local_98;
  int local_8c;
  DateTime local_88;
  double local_58;
  int *local_50;
  long local_48;
  ulong local_40;
  int m;
  int h;
  
  p->s = 0.0;
  p->validJD = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->nFloor = '\0';
  *(undefined4 *)&p->field_0x2c = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  local_c0 = 1;
  if (argc == 0) {
    iVar5 = sqlite3NotPureFunc(context);
    if (iVar5 == 0) {
      return local_c0;
    }
    iVar5 = setDateTimeToCurrent(context,p);
    return iVar5;
  }
  pVal = *argv;
  local_b8 = context;
  local_98 = argv;
  if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
      [pVal->flags & 0x3f] - 1 < 2) {
    dVar3 = sqlite3VdbeRealValue(pVal);
    setRawDateNumber(p,dVar3);
    goto LAB_001907d6;
  }
  zDate = sqlite3_value_text(pVal);
  if (zDate == (uchar *)0x0) {
    return local_c0;
  }
  uVar1 = *zDate;
  uVar16 = (ulong)(uVar1 == '-');
  iVar5 = getDigits((char *)(zDate + uVar16),"40f-21a-21d",&Y,&M,&M_1);
  if (iVar5 == 3) {
    zDate_00 = zDate + uVar16 + 9;
    do {
      do {
        pbVar7 = zDate_00 + 1;
        zDate_00 = zDate_00 + 1;
      } while ((ulong)*pbVar7 == 0x54);
    } while ((""[*pbVar7] & 1) != 0);
    iVar5 = parseHhMmSs((char *)zDate_00,p);
    if (iVar5 != 0) {
      if (*zDate_00 != '\0') goto LAB_001906c6;
      p->validHMS = '\0';
    }
    p->validJD = '\0';
    p->validYMD = '\x01';
    iVar5 = -Y;
    if (uVar1 != '-') {
      iVar5 = Y;
    }
    p->Y = iVar5;
    p->M = M;
    p->D = M_1;
    computeFloor(p);
    argv = local_98;
    if (p->tz != 0) {
      computeJD(p);
      argv = local_98;
    }
  }
  else {
LAB_001906c6:
    iVar5 = parseHhMmSs((char *)zDate,p);
    argv = local_98;
    if (iVar5 != 0) {
      iVar5 = sqlite3StrICmp((char *)zDate,"now");
      if ((iVar5 != 0) || (iVar5 = sqlite3NotPureFunc(local_b8), iVar5 == 0)) {
        iVar5 = sqlite3Strlen30((char *)zDate);
        iVar5 = sqlite3AtoF((char *)zDate,(double *)&local_88,iVar5,'\x01');
        if (0 < iVar5) {
          setRawDateNumber(p,(double)local_88.iJD);
          argv = local_98;
          goto LAB_001907d6;
        }
        iVar5 = sqlite3StrICmp((char *)zDate,"subsec");
        if ((iVar5 != 0) && (iVar5 = sqlite3StrICmp((char *)zDate,"subsecond"), iVar5 != 0)) {
          return 1;
        }
        iVar5 = sqlite3NotPureFunc(local_b8);
        if (iVar5 == 0) {
          return 1;
        }
        p->field_0x2c = p->field_0x2c | 4;
      }
      iVar5 = setDateTimeToCurrent(local_b8,p);
      argv = local_98;
      if (iVar5 != 0) {
        return local_c0;
      }
    }
  }
LAB_001907d6:
  local_50 = &p->Y;
  local_48 = (long)argc;
  local_c0 = 1;
  local_c8 = p;
  local_8c = argc;
  for (uVar16 = 1; (long)uVar16 < local_48; uVar16 = uVar16 + 1) {
    pbVar7 = sqlite3_value_text(argv[uVar16]);
    sqlite3_value_bytes(argv[uVar16]);
    if (pbVar7 == (byte *)0x0) {
      return local_c0;
    }
    bVar4 = *pbVar7;
    bVar2 = ""[bVar4];
    if (((ulong)bVar2 < 0x3a) && ((0x3ff280000000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      pbVar13 = pbVar7 + 1;
      uVar17 = 1;
      local_40 = uVar16;
      while( true ) {
        bVar2 = pbVar7[uVar17];
        if (((bVar2 == 0) || (bVar2 == 0x3a)) || ((""[bVar2] & 1) != 0)) break;
        if (bVar2 == 0x2d) {
          if ((int)uVar17 == 6) {
            iVar5 = getDigits((char *)pbVar13,"50f",&M);
            if (iVar5 == 1) {
              uStack_e0 = 6;
              goto LAB_001908ea;
            }
          }
          else if (((int)uVar17 == 5) && (iVar5 = getDigits((char *)pbVar13,"40f",&M), iVar5 == 1))
          {
            uStack_e0 = 5;
            goto LAB_001908ea;
          }
        }
        uVar17 = uVar17 + 1;
      }
      uStack_e0 = uVar17 & 0xffffffff;
LAB_001908ea:
      iVar5 = sqlite3AtoF((char *)pbVar7,(double *)&Y,(int)uStack_e0,'\x01');
      uVar6 = 1;
      argv = local_98;
      uVar16 = local_40;
      p = local_c8;
      if (0 < iVar5) {
        pbVar14 = pbVar7;
        if (pbVar7[uVar17] == 0x2d) {
          if ((bVar4 == 0x2d) || (uVar6 = 1, bVar4 == 0x2b)) {
            if ((int)uStack_e0 == 5) {
              iVar5 = getDigits((char *)pbVar13,"40f-20a-20d",&M,&M_1,&D);
              pbVar13 = pbVar7;
            }
            else {
              iVar5 = getDigits((char *)pbVar13,"50f-20a-20d",&M,&M_1,&D);
            }
            iVar12 = D;
            iVar8 = M_1;
            pDVar15 = local_c8;
            uVar6 = 1;
            argv = local_98;
            uVar16 = local_40;
            p = local_c8;
            if ((iVar5 == 3) && (uVar6 = 1, D < 0x1f && M_1 < 0xc)) {
              computeYMD_HMS(local_c8);
              p_00 = local_c8;
              pDVar15->validJD = '\0';
              iVar5 = M;
              if (bVar4 == 0x2d) {
                iVar8 = -iVar8;
                iVar12 = -iVar12;
                iVar5 = -M;
                D = iVar12;
              }
              iVar8 = pDVar15->M + iVar8;
              if (iVar8 < 1) {
                uVar6 = -((0xcU - iVar8) / 0xc);
              }
              else {
                uVar6 = (iVar8 - 1U) / 0xc;
              }
              local_c8->Y = pDVar15->Y + iVar5 + uVar6;
              local_c8->M = uVar6 * -0xc + iVar8;
              computeFloor(local_c8);
              computeJD(p_00);
              p_00->validYMD = '\0';
              p_00->validHMS = '\0';
              p_00->iJD = p_00->iJD + (long)iVar12 * 86400000;
              if ((ulong)pbVar13[0xb] == 0) goto LAB_001910a2;
              uVar6 = 1;
              argv = local_98;
              uVar16 = local_40;
              p = local_c8;
              if ((""[pbVar13[0xb]] & 1) != 0) {
                iVar5 = getDigits((char *)(pbVar13 + 0xc),"20c:20e",&h,&m);
                uStack_e0 = 2;
                uVar6 = 1;
                pbVar7 = pbVar13;
                argv = local_98;
                pbVar14 = pbVar13 + 0xc;
                uVar16 = local_40;
                p = local_c8;
                if (iVar5 == 2) goto LAB_001909f3;
              }
            }
          }
        }
        else {
LAB_001909f3:
          if (pbVar14[uStack_e0] == 0x3a) {
            local_88.s = 0.0;
            local_88.validJD = '\0';
            local_88.validYMD = '\0';
            local_88.validHMS = '\0';
            local_88.nFloor = '\0';
            local_88._44_4_ = 0;
            local_88.D = 0;
            local_88.h = 0;
            local_88.m = 0;
            local_88.tz = 0;
            local_88.iJD = 0;
            local_88.Y = 0;
            local_88.M = 0;
            iVar5 = parseHhMmSs((char *)(pbVar14 + ((ulong)*pbVar14 - 0x3a < 0xfffffffffffffff6)),
                                &local_88);
            uVar6 = 1;
            argv = local_98;
            uVar16 = local_40;
            p = local_c8;
            if (iVar5 == 0) {
              computeJD(&local_88);
              pDVar15 = local_c8;
              lVar9 = (local_88.iJD + -43200000) % 86400000;
              lVar18 = -lVar9;
              if (bVar4 != 0x2d) {
                lVar18 = lVar9;
              }
              computeJD(local_c8);
              pDVar15->validYMD = '\0';
              pDVar15->validHMS = '\0';
              pDVar15->tz = 0;
              pDVar15->iJD = pDVar15->iJD + lVar18;
LAB_001910a2:
              uVar6 = 0;
              argv = local_98;
              uVar16 = local_40;
              p = local_c8;
            }
          }
          else {
            pbVar7 = pbVar7 + (uStack_e0 - 1);
            do {
              pbVar13 = pbVar7 + 1;
              pbVar7 = pbVar7 + 1;
            } while ((""[*pbVar13] & 1) != 0);
            N = sqlite3Strlen30((char *)pbVar7);
            pDVar15 = local_c8;
            uVar6 = 1;
            argv = local_98;
            uVar16 = local_40;
            p = local_c8;
            if (0xfffffff7 < N - 0xb) {
              if ((pbVar7[N - 1] & 0xdf) == 0x53) {
                N = N - 1;
              }
              computeJD(local_c8);
              local_a8 = (double)CONCAT44(uStack_9c,Y);
              local_58 = *(double *)(&DAT_001a9590 + (ulong)(local_a8 < 0.0) * 8);
              pDVar15->nFloor = '\0';
              pfVar10 = &aXformType[0].rXform;
              for (lVar18 = 0; lVar18 != 6; lVar18 = lVar18 + 1) {
                if ((((N == ((anon_struct_16_4_82cfffc4 *)(pfVar10 + -3))->nName) &&
                     (iVar5 = sqlite3_strnicmp((char *)((long)pfVar10 + -0xb),(char *)pbVar7,N),
                     dVar3 = local_a8, pDVar15 = local_c8, iVar5 == 0)) &&
                    ((double)-pfVar10[-1] < local_a8)) && (local_a8 < (double)pfVar10[-1])) {
                  if ((int)lVar18 == 5) {
                    iVar5 = (int)local_a8;
                    computeYMD_HMS(local_c8);
                    pDVar15->Y = pDVar15->Y + iVar5;
LAB_001911b8:
                    computeFloor(pDVar15);
                    pDVar15->validJD = '\0';
                    local_a8 = local_a8 - (double)(int)dVar3;
                  }
                  else if ((int)lVar18 == 4) {
                    iVar8 = (int)local_a8;
                    computeYMD_HMS(local_c8);
                    iVar5 = pDVar15->M + iVar8;
                    if (iVar5 == 0 || SCARRY4(pDVar15->M,iVar8) != iVar5 < 0) {
                      uVar6 = -((0xcU - iVar5) / 0xc);
                    }
                    else {
                      uVar6 = (iVar5 - 1U) / 0xc;
                    }
                    pDVar15->Y = pDVar15->Y + uVar6;
                    pDVar15->M = uVar6 * -0xc + iVar5;
                    goto LAB_001911b8;
                  }
                  computeJD(pDVar15);
                  pDVar15->iJD = pDVar15->iJD +
                                 (long)((double)*pfVar10 * local_a8 * 1000.0 + local_58);
                  uVar6 = 0;
                  goto LAB_00190f4b;
                }
                pfVar10 = pfVar10 + 4;
              }
              uVar6 = 1;
              pDVar15 = local_c8;
LAB_00190f4b:
              pDVar15->validYMD = '\0';
              pDVar15->validHMS = '\0';
              pDVar15->tz = 0;
              argv = local_98;
              uVar16 = local_40;
              p = local_c8;
            }
          }
        }
      }
LAB_001910b6:
      if (uVar6 != 0) {
        return local_c0;
      }
      goto LAB_001910be;
    }
    switch(bVar2) {
    case 0x61:
      iVar5 = sqlite3StrICmp((char *)pbVar7,"auto");
      if (1 < uVar16) {
        return local_c0;
      }
      if (iVar5 != 0) {
        return local_c0;
      }
      bVar4 = p->field_0x2c;
      if (((bVar4 & 1) != 0) && (p->validJD == '\0')) {
        dVar3 = p->s;
        if ((dVar3 < -210866760000.0) || (253402300799.0 < dVar3)) break;
        dVar3 = dVar3 * 1000.0 + 210866760000000.0;
LAB_00191106:
        p->validHMS = '\0';
        p->tz = 0;
        p->iJD = (long)(dVar3 + 0.5);
        p->validJD = '\x01';
        p->validYMD = '\0';
      }
      goto LAB_00191127;
    case 0x62:
    case 100:
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6b:
      goto switchD_0019097b_caseD_62;
    case 99:
      iVar5 = sqlite3StrICmp((char *)pbVar7,"ceiling");
      if (iVar5 != 0) {
        return local_c0;
      }
      computeJD(p);
      p->validYMD = '\0';
      p->validHMS = '\0';
      p->tz = 0;
      p->nFloor = '\0';
      break;
    case 0x66:
      iVar5 = sqlite3StrICmp((char *)pbVar7,"floor");
      if (iVar5 != 0) {
        return local_c0;
      }
      computeJD(p);
      p->iJD = p->iJD - ((long)p->nFloor * 0x5265c0000000000 >> 0x20);
LAB_00190db3:
      p->validYMD = '\0';
      p->validHMS = '\0';
      p->tz = 0;
      break;
    case 0x6a:
      iVar5 = sqlite3StrICmp((char *)pbVar7,"julianday");
      if (1 < uVar16) {
        return local_c0;
      }
      if (iVar5 != 0) {
        return local_c0;
      }
      if (p->validJD == '\0') {
        return local_c0;
      }
      bVar4 = p->field_0x2c;
      if ((bVar4 & 1) == 0) {
        return local_c0;
      }
LAB_00191127:
      p->field_0x2c = bVar4 & 0xfe;
      break;
    case 0x6c:
      iVar5 = sqlite3StrICmp((char *)pbVar7,"localtime");
      if (iVar5 != 0) {
        return local_c0;
      }
      iVar5 = sqlite3NotPureFunc(local_b8);
      if (iVar5 == 0) {
        return local_c0;
      }
      bVar4 = p->field_0x2c;
      uVar6 = 0;
      if ((bVar4 & 0x10) == 0) {
        uVar6 = toLocaltime(p,local_b8);
        bVar4 = p->field_0x2c;
      }
      p->field_0x2c = bVar4 & 0xe7 | 0x10;
      goto LAB_001910b6;
    default:
      if (bVar2 == 0x73) {
        iVar5 = sqlite3_strnicmp((char *)pbVar7,"start of ",9);
        if (iVar5 == 0) {
          if (((p->validJD == '\0') && (p->validYMD == '\0')) && (p->validHMS == '\0')) {
            return local_c0;
          }
          pbVar7 = pbVar7 + 9;
          computeYMD(p);
          p->validHMS = '\x01';
          p->h = 0;
          p->m = 0;
          p->s = 0.0;
          p->field_0x2c = p->field_0x2c & 0xfe;
          p->tz = 0;
          p->validJD = '\0';
          iVar5 = sqlite3StrICmp((char *)pbVar7,"month");
          if (iVar5 == 0) {
            p->D = 1;
          }
          else {
            iVar5 = sqlite3StrICmp((char *)pbVar7,"year");
            if (iVar5 != 0) {
              iVar5 = sqlite3StrICmp((char *)pbVar7,"day");
              uVar6 = (uint)(iVar5 != 0);
              goto LAB_001910b6;
            }
            p->M = 1;
            p->D = 1;
          }
        }
        else {
          iVar5 = sqlite3StrICmp((char *)pbVar7,"subsec");
          if ((iVar5 != 0) && (iVar5 = sqlite3StrICmp((char *)pbVar7,"subsecond"), iVar5 != 0)) {
            return local_c0;
          }
          p->field_0x2c = p->field_0x2c | 4;
        }
      }
      else {
        if (bVar2 != 0x75) {
          if (bVar2 != 0x77) {
            return local_c0;
          }
          iVar5 = sqlite3_strnicmp((char *)pbVar7,"weekday ",8);
          if (iVar5 != 0) {
            return local_c0;
          }
          iVar5 = sqlite3Strlen30((char *)(pbVar7 + 8));
          iVar5 = sqlite3AtoF((char *)(pbVar7 + 8),(double *)&Y,iVar5,'\x01');
          if (iVar5 < 1) {
            return local_c0;
          }
          dVar3 = (double)CONCAT44(uStack_9c,Y);
          if (dVar3 < 0.0) {
            return local_c0;
          }
          if (7.0 <= dVar3) {
            return local_c0;
          }
          if (dVar3 != (double)(int)dVar3) {
            return local_c0;
          }
          if (NAN(dVar3) || NAN((double)(int)dVar3)) {
            return local_c0;
          }
          computeYMD_HMS(p);
          p->tz = 0;
          p->validJD = '\0';
          computeJD(p);
          lVar18 = ((p->iJD + 0x7b98a00) / 86400000) % 7;
          if ((int)dVar3 < lVar18) {
            lVar18 = lVar18 + -7;
          }
          p->iJD = ((int)dVar3 - lVar18) * 86400000 + p->iJD;
          goto LAB_00190db3;
        }
        iVar5 = sqlite3StrICmp((char *)pbVar7,"unixepoch");
        if ((iVar5 == 0) && (bVar4 = p->field_0x2c, (bVar4 & 1) != 0)) {
          if (1 < uVar16) {
            return local_c0;
          }
          dVar3 = p->s * 1000.0 + 210866760000000.0;
          if (dVar3 < 0.0) {
            return local_c0;
          }
          if (464269060800000.0 <= dVar3) {
            return local_c0;
          }
          goto LAB_00191106;
        }
        iVar5 = sqlite3StrICmp((char *)pbVar7,"utc");
        if (iVar5 != 0) {
          return local_c0;
        }
        iVar5 = sqlite3NotPureFunc(local_b8);
        if (iVar5 == 0) {
          return local_c0;
        }
        if ((p->field_0x2c & 8) == 0) {
          computeJD(p);
          dVar3 = (double)p->iJD;
          lVar18 = 0;
          dVar11 = dVar3;
          uVar6 = 0;
          do {
            dVar11 = (double)((long)dVar11 - lVar18);
            local_88.m = 0;
            local_88.tz = 0;
            local_88.s = 0.0;
            local_88.Y = 0;
            local_88.M = 0;
            local_88.D = 0;
            local_88.h = 0;
            local_88.validJD = '\x01';
            local_88.validYMD = '\0';
            local_88.validHMS = '\0';
            local_88.nFloor = '\0';
            local_88._44_4_ = 0;
            local_88.iJD = (sqlite3_int64)dVar11;
            iVar5 = toLocaltime(&local_88,local_b8);
            if (iVar5 != 0) {
              return local_c0;
            }
            computeJD(&local_88);
            lVar18 = local_88.iJD - (long)dVar3;
          } while ((lVar18 != 0) && (bVar19 = uVar6 < 3, uVar6 = uVar6 + 1, bVar19));
          *(undefined8 *)(local_50 + 4) = 0;
          *(double *)(local_50 + 6) = 0.0;
          *(undefined8 *)(local_50 + 8) = 0;
          local_50[0] = 0;
          local_50[1] = 0;
          *(undefined8 *)(local_50 + 2) = 0;
          local_c8->iJD = (sqlite3_int64)dVar11;
          local_c8->validJD = '\x01';
          local_c8->field_0x2c = 8;
          p = local_c8;
        }
      }
    }
LAB_001910be:
  }
  computeJD(p);
  if (((((p->field_0x2c & 2) == 0) && ((ulong)p->iJD < 0x1a6401072fe00)) &&
      (local_c0 = 0, local_8c == 1)) && ((p->validYMD != '\0' && (0x1c < p->D)))) {
    p->validYMD = '\0';
  }
switchD_0019097b_caseD_62:
  return local_c0;
}

Assistant:

static int isDate(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    if( !sqlite3NotPureFunc(context) ) return 1;
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p, i) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  if( argc==1 && p->validYMD && p->D>28 ){
    /* Make sure a YYYY-MM-DD is normalized.
    ** Example: 2023-02-31 -> 2023-03-03 */
    assert( p->validJD );
    p->validYMD = 0;
  }
  return 0;
}